

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int UnixVfs_Mmap(char *zPath,void **ppMap,jx9_int64 *pSize)

{
  int __fd;
  void *pvVar1;
  int iVar2;
  stat st;
  stat sStack_b8;
  
  __fd = open(zPath,0);
  if (__fd < 0) {
    iVar2 = -1;
  }
  else {
    fstat(__fd,&sStack_b8);
    iVar2 = 0;
    pvVar1 = mmap((void *)0x0,sStack_b8.st_size,1,2,__fd,0);
    if (pvVar1 == (void *)0xffffffffffffffff) {
      iVar2 = -1;
    }
    else {
      *ppMap = pvVar1;
      *pSize = sStack_b8.st_size;
    }
    close(__fd);
  }
  return iVar2;
}

Assistant:

static int UnixVfs_Mmap(const char *zPath, void **ppMap, jx9_int64 *pSize)
{
	struct stat st;
	void *pMap;
	int fd;
	int rc;
	/* Open the file in a read-only mode */
	fd = open(zPath, O_RDONLY);
	if( fd < 0 ){
		return -1;
	}
	/* stat the handle */
	fstat(fd, &st);
	/* Obtain a memory view of the whole file */
	pMap = mmap(0, st.st_size, PROT_READ, MAP_PRIVATE|MAP_FILE, fd, 0);
	rc = JX9_OK;
	if( pMap == MAP_FAILED ){
		rc = -1;
	}else{
		/* Point to the memory view */
		*ppMap = pMap;
		*pSize = (jx9_int64)st.st_size;
	}
	close(fd);
	return rc;
}